

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O3

XML_Error doContent(XML_Parser parser,int startTagLevel,ENCODING *enc,char *s,char *end,
                   char **nextPtr)

{
  char cVar1;
  binding *pbVar2;
  BINDING *pBVar3;
  int iVar4;
  XML_Error XVar5;
  long lVar6;
  code *pcVar7;
  undefined8 *puVar8;
  void *__dest;
  XML_Char *pXVar9;
  NAMED *pNVar10;
  long lVar11;
  long *plVar12;
  long *plVar13;
  long *plVar14;
  TAG_NAME *pTVar15;
  undefined8 uVar16;
  long lVar17;
  BINDING *b;
  char *pcVar18;
  char *next;
  char *fromPtr;
  XML_Char *toPtr;
  TAG_NAME *local_b0;
  TAG_NAME *local_a8;
  char *local_a0;
  undefined8 *local_98;
  int local_8c;
  undefined1 local_88 [16];
  TAG_NAME local_78;
  NAMED *local_60;
  STRING_POOL *local_58;
  undefined8 *local_50;
  HASH_TABLE *local_48;
  STRING_POOL *local_40;
  BINDING **local_38;
  
  if (*(ENCODING **)((long)parser + 0x118) == enc) {
    local_98 = (undefined8 *)((long)parser + 0x218);
    local_88._8_8_ = (long)parser + 0x220;
  }
  else {
    local_98 = *(undefined8 **)((long)parser + 0x230);
    local_88._8_8_ = local_98 + 1;
  }
  *local_98 = s;
  local_58 = (STRING_POOL *)((long)parser + 0x418);
  local_50 = (undefined8 *)((long)parser + 0x428);
  local_40 = (STRING_POOL *)((long)parser + 0x330);
  local_48 = (HASH_TABLE *)((long)parser + 0x290);
  local_b0 = (TAG_NAME *)s;
  local_a0 = end;
  local_8c = startTagLevel;
  do {
    local_a8 = local_b0;
    iVar4 = (*enc->scanners[1])(enc,(char *)local_b0,end,(char **)&local_a8);
    puVar8 = local_98;
    *(TAG_NAME **)local_88._8_8_ = local_a8;
    switch(iVar4) {
    case 0:
      *local_98 = local_a8;
      return XML_ERROR_INVALID_TOKEN;
    case 1:
      if ((*(long *)((long)parser + 0x68) == 0) &&
         (XVar5 = storeAtts(parser,enc,(char *)local_b0,(TAG_NAME *)0x0,(BINDING **)0x0),
         XVar5 != XML_ERROR_NONE)) {
        return XVar5;
      }
    case 2:
      puVar8 = *(undefined8 **)((long)parser + 0x3d8);
      if (puVar8 == (undefined8 *)0x0) {
        puVar8 = (undefined8 *)(**(code **)((long)parser + 0x18))(0x48);
        if (puVar8 == (undefined8 *)0x0) {
          return XML_ERROR_NO_MEMORY;
        }
        lVar11 = (**(code **)((long)parser + 0x18))(0x20);
        puVar8[6] = lVar11;
        if (lVar11 == 0) {
          return XML_ERROR_NO_MEMORY;
        }
        puVar8[7] = lVar11 + 0x20;
      }
      else {
        *(undefined8 *)((long)parser + 0x3d8) = *puVar8;
      }
      puVar8[8] = 0;
      *puVar8 = *(undefined8 *)((long)parser + 0x3d0);
      *(undefined8 **)((long)parser + 0x3d0) = puVar8;
      puVar8[4] = 0;
      pcVar18 = (char *)((long)&local_b0->str + (long)enc->minBytesPerChar);
      puVar8[1] = pcVar18;
      iVar4 = (*enc->nameLength)(enc,pcVar18);
      *(int *)(puVar8 + 2) = iVar4;
      if (nextPtr != (char **)0x0) {
        __dest = (void *)puVar8[6];
        if (puVar8[7] - (long)__dest < (long)(iVar4 + 1)) {
          __dest = (void *)(**(code **)((long)parser + 0x20))(__dest,(long)(iVar4 << 2));
          puVar8[6] = __dest;
          if (__dest == (void *)0x0) {
            return XML_ERROR_NO_MEMORY;
          }
          puVar8[7] = (long)(iVar4 << 2) + (long)__dest;
          iVar4 = *(int *)(puVar8 + 2);
        }
        memcpy(__dest,(void *)puVar8[1],(long)iVar4);
        puVar8[1] = puVar8[6];
      }
      *(int *)((long)parser + 0x23c) = *(int *)((long)parser + 0x23c) + 1;
      pTVar15 = (TAG_NAME *)(puVar8 + 3);
      if (*(long *)((long)parser + 0x68) == 0) {
        pTVar15->str = (XML_Char *)0x0;
        lVar11 = *(long *)((long)parser + 0xa0);
        startTagLevel = local_8c;
LAB_004d3fac:
        end = local_a0;
        if (lVar11 != 0) {
LAB_004d40d5:
          reportDefault(parser,enc,(char *)local_b0,(char *)local_a8);
        }
      }
      else {
        local_38 = (BINDING **)(puVar8 + 8);
        while( true ) {
          local_88._0_8_ = puVar8[1];
          lVar11 = (long)*(int *)(puVar8 + 2);
          pBVar3 = (BINDING *)((long)&((BINDING *)local_88._0_8_)->prefix + lVar11);
          if (nextPtr == (char **)0x0) {
            lVar11 = 0;
          }
          local_78.str = (XML_Char *)(lVar11 + puVar8[6]);
          puVar8[3] = local_78.str;
          (*enc->utf8Convert)(enc,(char **)local_88,(char *)pBVar3,&local_78.str,
                              (char *)(puVar8[7] + -1));
          if ((BINDING *)local_88._0_8_ == pBVar3) break;
          lVar17 = (long)((*(int *)(puVar8 + 7) - (int)puVar8[6]) * 2);
          lVar11 = (**(code **)((long)parser + 0x20))(puVar8[6],lVar17);
          puVar8[6] = lVar11;
          if (lVar11 == 0) {
            return XML_ERROR_NO_MEMORY;
          }
          puVar8[7] = lVar17 + lVar11;
          if (nextPtr != (char **)0x0) {
            puVar8[1] = lVar11;
          }
        }
        *local_78.str = '\0';
        XVar5 = storeAtts(parser,enc,(char *)local_b0,pTVar15,local_38);
        if (XVar5 != XML_ERROR_NONE) {
          return XVar5;
        }
        (**(code **)((long)parser + 0x68))
                  (*(undefined8 *)((long)parser + 8),pTVar15->str,
                   *(undefined8 *)((long)parser + 0x400));
        plVar14 = *(long **)((long)parser + 0x418);
        if (*(long **)((long)parser + 0x420) == (long *)0x0) {
LAB_004d431e:
          *(long **)((long)parser + 0x420) = plVar14;
        }
        else {
          plVar13 = plVar14;
          plVar12 = *(long **)((long)parser + 0x420);
          if (plVar14 != (long *)0x0) {
            do {
              plVar14 = plVar13;
              plVar13 = (long *)*plVar14;
              *plVar14 = (long)plVar12;
              plVar12 = plVar14;
            } while (plVar13 != (long *)0x0);
            goto LAB_004d431e;
          }
        }
        local_58->blocks = (BLOCK *)0x0;
        local_50[2] = 0;
        *local_50 = 0;
        local_50[1] = 0;
        end = local_a0;
        startTagLevel = local_8c;
      }
      break;
    case 3:
      if (*(long *)((long)parser + 0x68) == 0) {
        XVar5 = storeAtts(parser,enc,(char *)local_b0,(TAG_NAME *)0x0,(BINDING **)0x0);
        if (XVar5 != XML_ERROR_NONE) {
          return XVar5;
        }
        goto switchD_004d3ab6_caseD_4;
      }
LAB_004d3c3d:
      pcVar18 = (char *)((long)&local_b0->str + (long)enc->minBytesPerChar);
      local_88._0_8_ = (BINDING *)0x0;
      iVar4 = (*enc->nameLength)(enc,pcVar18);
      local_78.str = poolStoreString(local_58,enc,pcVar18,pcVar18 + iVar4);
      if (local_78.str == (XML_Char *)0x0) {
        return XML_ERROR_NO_MEMORY;
      }
      *(undefined8 *)((long)parser + 0x438) = *(undefined8 *)((long)parser + 0x430);
      XVar5 = storeAtts(parser,enc,(char *)local_b0,&local_78,(BINDING **)local_88);
      if (XVar5 != XML_ERROR_NONE) {
        return XVar5;
      }
      *(undefined8 *)((long)parser + 0x438) = *(undefined8 *)((long)parser + 0x430);
      if (*(code **)((long)parser + 0x68) != (code *)0x0) {
        (**(code **)((long)parser + 0x68))
                  (*(undefined8 *)((long)parser + 8),local_78.str,
                   *(undefined8 *)((long)parser + 0x400));
      }
      pcVar7 = *(code **)((long)parser + 0x70);
      if (pcVar7 != (code *)0x0) {
        if (*(long *)((long)parser + 0x68) != 0) {
          *local_98 = *(undefined8 *)local_88._8_8_;
          pcVar7 = *(code **)((long)parser + 0x70);
        }
        (*pcVar7)(*(undefined8 *)((long)parser + 8),local_78.str);
      }
      plVar14 = *(long **)((long)parser + 0x418);
      if (*(long **)((long)parser + 0x420) == (long *)0x0) {
LAB_004d3fbf:
        *(long **)((long)parser + 0x420) = plVar14;
      }
      else {
        plVar13 = plVar14;
        plVar12 = *(long **)((long)parser + 0x420);
        if (plVar14 != (long *)0x0) {
          do {
            plVar14 = plVar13;
            plVar13 = (long *)*plVar14;
            *plVar14 = (long)plVar12;
            plVar12 = plVar14;
          } while (plVar13 != (long *)0x0);
          goto LAB_004d3fbf;
        }
      }
      local_58->blocks = (BLOCK *)0x0;
      local_50[2] = 0;
      *local_50 = 0;
      local_50[1] = 0;
      end = local_a0;
      pBVar3 = (BINDING *)local_88._0_8_;
      while (local_a0 = end, pBVar3 != (BINDING *)0x0) {
        if (*(code **)((long)parser + 0xd0) != (code *)0x0) {
          (**(code **)((long)parser + 0xd0))(*(undefined8 *)((long)parser + 8),pBVar3->prefix->name)
          ;
        }
        pbVar2 = pBVar3->nextTagBinding;
        pBVar3->nextTagBinding = *(binding **)((long)parser + 1000);
        *(BINDING **)((long)parser + 1000) = pBVar3;
        pBVar3->prefix->binding = pBVar3->prevPrefixBinding;
        end = local_a0;
        pBVar3 = pbVar2;
      }
      goto LAB_004d402f;
    case 4:
switchD_004d3ab6_caseD_4:
      if ((*(long *)((long)parser + 0x68) != 0) || (*(long *)((long)parser + 0x70) != 0))
      goto LAB_004d3c3d;
      if (*(long *)((long)parser + 0xa0) != 0) {
        reportDefault(parser,enc,(char *)local_b0,(char *)local_a8);
      }
LAB_004d402f:
      iVar4 = *(int *)((long)parser + 0x23c);
joined_r0x004d4165:
      if (iVar4 == 0) {
        XVar5 = epilogProcessor(parser,(char *)local_a8,end,nextPtr);
        return XVar5;
      }
      break;
    case 5:
      if (*(int *)((long)parser + 0x23c) != startTagLevel) {
        puVar8 = *(undefined8 **)((long)parser + 0x3d0);
        *(undefined8 *)((long)parser + 0x3d0) = *puVar8;
        *puVar8 = *(undefined8 *)((long)parser + 0x3d8);
        *(undefined8 **)((long)parser + 0x3d8) = puVar8;
        pcVar18 = (char *)((long)&local_b0->str + (long)enc->minBytesPerChar * 2);
        iVar4 = (*enc->nameLength)(enc,pcVar18);
        if ((iVar4 != *(int *)(puVar8 + 2)) ||
           (iVar4 = bcmp((void *)puVar8[1],pcVar18,(long)iVar4), iVar4 != 0)) {
          *local_98 = pcVar18;
          return XML_ERROR_TAG_MISMATCH;
        }
        *(int *)((long)parser + 0x23c) = *(int *)((long)parser + 0x23c) + -1;
        pcVar7 = *(code **)((long)parser + 0x70);
        if ((pcVar7 == (code *)0x0) || (lVar11 = puVar8[3], lVar11 == 0)) {
          if (*(long *)((long)parser + 0xa0) != 0) {
            reportDefault(parser,enc,(char *)local_b0,(char *)local_a8);
          }
        }
        else {
          lVar17 = puVar8[4];
          if (lVar17 != 0) {
            iVar4 = *(int *)(puVar8 + 5);
            lVar6 = 0;
            do {
              cVar1 = *(char *)(lVar17 + lVar6);
              *(char *)(lVar11 + iVar4 + lVar6) = cVar1;
              lVar6 = lVar6 + 1;
            } while (cVar1 != '\0');
            pcVar7 = *(code **)((long)parser + 0x70);
            lVar11 = puVar8[3];
          }
          (*pcVar7)(*(undefined8 *)((long)parser + 8),lVar11);
        }
        plVar14 = (long *)puVar8[8];
        while (plVar14 != (long *)0x0) {
          plVar13 = plVar14;
          if (*(code **)((long)parser + 0xd0) != (code *)0x0) {
            (**(code **)((long)parser + 0xd0))
                      (*(undefined8 *)((long)parser + 8),*(undefined8 *)*plVar14);
            plVar13 = (long *)puVar8[8];
          }
          plVar13 = (long *)plVar13[1];
          puVar8[8] = plVar13;
          plVar14[1] = *(long *)((long)parser + 1000);
          *(long **)((long)parser + 1000) = plVar14;
          *(long *)(*plVar14 + 8) = plVar14[2];
          plVar14 = plVar13;
        }
        iVar4 = *(int *)((long)parser + 0x23c);
        end = local_a0;
        goto joined_r0x004d4165;
      }
      goto LAB_004d460a;
    case 6:
      pcVar7 = *(code **)((long)parser + 0x78);
      if (pcVar7 == (code *)0x0) goto switchD_004d3ab6_default;
      if (enc->isUtf8 == '\0') {
        while( true ) {
          local_78.str = *(XML_Char **)((long)parser + 0x58);
          (*enc->utf8Convert)(enc,(char **)&local_b0,(char *)local_a8,&local_78.str,
                              *(char **)((long)parser + 0x60));
          *(TAG_NAME **)local_88._8_8_ = local_b0;
          (**(code **)((long)parser + 0x78))
                    (*(undefined8 *)((long)parser + 8),*(undefined8 *)((long)parser + 0x58),
                     (int)local_78.str - (int)*(undefined8 *)((long)parser + 0x58));
          if (local_b0 == local_a8) break;
          *puVar8 = local_b0;
        }
        break;
      }
      uVar16 = *(undefined8 *)((long)parser + 8);
      iVar4 = (int)local_a8 - (int)local_b0;
      pTVar15 = local_b0;
LAB_004d3e29:
      (*pcVar7)(uVar16,pTVar15,iVar4);
      break;
    case 7:
      pcVar7 = *(code **)((long)parser + 0x78);
      if (pcVar7 != (code *)0x0) {
        local_78.str = (XML_Char *)CONCAT71(local_78.str._1_7_,10);
        uVar16 = *(undefined8 *)((long)parser + 8);
        pTVar15 = &local_78;
LAB_004d3e24:
        iVar4 = 1;
        goto LAB_004d3e29;
      }
    default:
switchD_004d3ab6_default:
      lVar11 = *(long *)((long)parser + 0xa0);
joined_r0x004d40c5:
      if (lVar11 == 0) break;
      goto LAB_004d40d5;
    case 8:
      if (*(code **)((long)parser + 0x90) == (code *)0x0) {
        if (*(long *)((long)parser + 0xa0) != 0) {
          reportDefault(parser,enc,(char *)local_b0,(char *)local_a8);
        }
      }
      else {
        (**(code **)((long)parser + 0x90))(*(undefined8 *)((long)parser + 8));
      }
      XVar5 = doCdataSection(parser,enc,(char **)&local_a8,end,nextPtr);
      if (local_a8 == (TAG_NAME *)0x0) {
        *(code **)((long)parser + 0x208) = cdataSectionProcessor;
        return XVar5;
      }
      break;
    case 9:
      iVar4 = (*enc->predefinedEntityName)
                        (enc,(char *)((long)&local_b0->str + (long)enc->minBytesPerChar),
                         (char *)((long)local_a8 - (long)enc->minBytesPerChar));
      local_88[0] = (char)iVar4;
      if ((char)iVar4 != '\0') {
        pcVar7 = *(code **)((long)parser + 0x78);
        if (pcVar7 == (code *)0x0) goto LAB_004d40bd;
        uVar16 = *(undefined8 *)((long)parser + 8);
        pTVar15 = (TAG_NAME *)local_88;
        goto LAB_004d3e24;
      }
      pXVar9 = poolStoreString(local_40,enc,
                               (char *)((long)&local_b0->str + (long)enc->minBytesPerChar),
                               (char *)((long)local_a8 - (long)enc->minBytesPerChar));
      if (pXVar9 == (XML_Char *)0x0) {
        return XML_ERROR_NO_MEMORY;
      }
      pNVar10 = lookup(local_48,pXVar9,0);
      *(undefined8 *)((long)parser + 0x348) = *(undefined8 *)((long)parser + 0x350);
      if (pNVar10 != (NAMED *)0x0) {
        if (*(char *)&pNVar10[7].name != '\0') {
          return XML_ERROR_RECURSIVE_ENTITY_REF;
        }
        if (pNVar10[6].name != (KEY)0x0) {
          return XML_ERROR_BINARY_ENTITY_REF;
        }
        pcVar18 = pNVar10[1].name;
        if (pcVar18 == (char *)0x0) {
          if (*(long *)((long)parser + 0xe0) == 0) goto LAB_004d439d;
          *(undefined1 *)&pNVar10[7].name = 1;
          pXVar9 = getContext(parser);
          *(undefined1 *)&pNVar10[7].name = 0;
          if (pXVar9 == (XML_Char *)0x0) {
            return XML_ERROR_NO_MEMORY;
          }
          iVar4 = (**(code **)((long)parser + 0xe0))
                            (*(undefined8 *)((long)parser + 0xe8),pXVar9,pNVar10[4].name,
                             pNVar10[3].name);
          if (iVar4 == 0) {
            return XML_ERROR_EXTERNAL_ENTITY_HANDLING;
          }
          *(undefined8 *)((long)parser + 0x430) = *(undefined8 *)((long)parser + 0x438);
          end = local_a0;
        }
        else if ((*(long *)((long)parser + 0xa0) == 0) || (*(int *)((long)parser + 0x238) != 0)) {
          *(undefined1 *)&pNVar10[7].name = 1;
          local_78._16_8_ = *(undefined8 *)((long)parser + 0x230);
          *(TAG_NAME **)((long)parser + 0x230) = &local_78;
          local_78.str = (XML_Char *)0x0;
          local_78.localPart = (XML_Char *)0x0;
          local_60 = pNVar10;
          XVar5 = doContent(parser,*(int *)((long)parser + 0x23c),
                            *(ENCODING **)((long)parser + 0x1b8),pcVar18,
                            pcVar18 + *(int *)&pNVar10[2].name,(char **)0x0);
          *(undefined1 *)&pNVar10[7].name = 0;
          *(undefined8 *)((long)parser + 0x230) = local_78._16_8_;
          end = local_a0;
          if (XVar5 != XML_ERROR_NONE) {
            return XVar5;
          }
        }
        else {
          reportDefault(parser,enc,(char *)local_b0,(char *)local_a8);
          end = local_a0;
        }
        break;
      }
      if (*(int *)((long)parser + 0x360) != 0) {
        return XML_ERROR_UNDEFINED_ENTITY;
      }
      if (*(int *)((long)parser + 0x364) != 0) {
        return XML_ERROR_UNDEFINED_ENTITY;
      }
LAB_004d439d:
      lVar11 = *(long *)((long)parser + 0xa0);
      goto LAB_004d3fac;
    case 10:
      iVar4 = (*enc->charRefNumber)(enc,(char *)local_b0);
      if (iVar4 < 0) {
        return XML_ERROR_BAD_CHAR_REF;
      }
      pcVar7 = *(code **)((long)parser + 0x78);
      if (pcVar7 != (code *)0x0) {
        uVar16 = *(undefined8 *)((long)parser + 8);
        iVar4 = cm_expat_XmlUtf8Encode(iVar4,(char *)&local_78);
        startTagLevel = local_8c;
        end = local_a0;
        (*pcVar7)(uVar16,&local_78,iVar4);
        break;
      }
LAB_004d40bd:
      lVar11 = *(long *)((long)parser + 0xa0);
      goto joined_r0x004d40c5;
    case 0xb:
      iVar4 = reportProcessingInstruction(parser,enc,(char *)local_b0,(char *)local_a8);
      goto LAB_004d3d9b;
    case 0xc:
      return XML_ERROR_MISPLACED_XML_PI;
    case 0xd:
      iVar4 = reportComment(parser,enc,(char *)local_b0,(char *)local_a8);
LAB_004d3d9b:
      if (iVar4 == 0) {
        return XML_ERROR_NO_MEMORY;
      }
      break;
    case -5:
      if (nextPtr == (char **)0x0) {
        if (*(code **)((long)parser + 0x78) == (code *)0x0) {
          if (*(long *)((long)parser + 0xa0) != 0) {
            reportDefault(parser,enc,(char *)local_b0,end);
          }
        }
        else if (enc->isUtf8 == '\0') {
          local_78.str = *(XML_Char **)((long)parser + 0x58);
          (*enc->utf8Convert)(enc,(char **)&local_b0,local_a0,&local_78.str,
                              *(char **)((long)parser + 0x60));
          end = local_a0;
          (**(code **)((long)parser + 0x78))
                    (*(undefined8 *)((long)parser + 8),*(undefined8 *)((long)parser + 0x58),
                     (int)local_78.str - (int)*(undefined8 *)((long)parser + 0x58));
          puVar8 = local_98;
        }
        else {
          (**(code **)((long)parser + 0x78))
                    (*(undefined8 *)((long)parser + 8),local_b0,(int)end - (int)local_b0);
          puVar8 = local_98;
        }
        if (startTagLevel == 0) {
          *puVar8 = end;
LAB_004d4616:
          XVar5 = XML_ERROR_NO_ELEMENTS;
        }
        else {
          XVar5 = XML_ERROR_NONE;
          if (*(int *)((long)parser + 0x23c) != startTagLevel) {
            *local_98 = local_a0;
LAB_004d460a:
            XVar5 = XML_ERROR_ASYNC_ENTITY;
          }
        }
      }
      else {
LAB_004d44c7:
        *nextPtr = (char *)local_b0;
        XVar5 = XML_ERROR_NONE;
      }
      return XVar5;
    case -4:
      if (nextPtr != (char **)0x0) goto LAB_004d44c7;
      if (0 < startTagLevel) goto LAB_004d459c;
      goto LAB_004d4616;
    case -3:
      if (nextPtr != (char **)0x0) goto LAB_004d44c7;
      *(char **)local_88._8_8_ = end;
      if (*(code **)((long)parser + 0x78) == (code *)0x0) {
        if (*(long *)((long)parser + 0xa0) != 0) {
          reportDefault(parser,enc,(char *)local_b0,end);
        }
      }
      else {
        local_78.str = (XML_Char *)CONCAT71(local_78.str._1_7_,10);
        (**(code **)((long)parser + 0x78))(*(undefined8 *)((long)parser + 8),&local_78,1);
      }
      if (startTagLevel != 0) {
LAB_004d459c:
        if (*(int *)((long)parser + 0x23c) != startTagLevel) {
          return XML_ERROR_ASYNC_ENTITY;
        }
        return XML_ERROR_NONE;
      }
      goto LAB_004d4616;
    case -2:
      if (nextPtr == (char **)0x0) {
        return XML_ERROR_PARTIAL_CHAR;
      }
      goto LAB_004d44c7;
    case -1:
      if (nextPtr == (char **)0x0) {
        return XML_ERROR_UNCLOSED_TOKEN;
      }
      goto LAB_004d44c7;
    }
    local_b0 = local_a8;
    *local_98 = local_a8;
  } while( true );
}

Assistant:

static enum XML_Error
doContent(XML_Parser parser,
          int startTagLevel,
          const ENCODING *enc,
          const char *s,
          const char *end,
          const char **nextPtr)
{
  const char **eventPP;
  const char **eventEndPP;
  if (enc == encoding) {
    eventPP = &eventPtr;
    eventEndPP = &eventEndPtr;
  }
  else {
    eventPP = &(openInternalEntities->internalEventPtr);
    eventEndPP = &(openInternalEntities->internalEventEndPtr);
  }
  *eventPP = s;
  for (;;) {
    const char *next = s; /* XmlContentTok doesn't always set the last arg */
    int tok = XmlContentTok(enc, s, end, &next);
    *eventEndPP = next;
    switch (tok) {
    case XML_TOK_TRAILING_CR:
      if (nextPtr) {
        *nextPtr = s;
        return XML_ERROR_NONE;
      }
      *eventEndPP = end;
      if (characterDataHandler) {
        XML_Char c = 0xA;
        characterDataHandler(handlerArg, &c, 1);
      }
      else if (defaultHandler)
        reportDefault(parser, enc, s, end);
      if (startTagLevel == 0)
        return XML_ERROR_NO_ELEMENTS;
      if (tagLevel != startTagLevel)
        return XML_ERROR_ASYNC_ENTITY;
      return XML_ERROR_NONE;
    case XML_TOK_NONE:
      if (nextPtr) {
        *nextPtr = s;
        return XML_ERROR_NONE;
      }
      if (startTagLevel > 0) {
        if (tagLevel != startTagLevel)
          return XML_ERROR_ASYNC_ENTITY;
        return XML_ERROR_NONE;
      }
      return XML_ERROR_NO_ELEMENTS;
    case XML_TOK_INVALID:
      *eventPP = next;
      return XML_ERROR_INVALID_TOKEN;
    case XML_TOK_PARTIAL:
      if (nextPtr) {
        *nextPtr = s;
        return XML_ERROR_NONE;
      }
      return XML_ERROR_UNCLOSED_TOKEN;
    case XML_TOK_PARTIAL_CHAR:
      if (nextPtr) {
        *nextPtr = s;
        return XML_ERROR_NONE;
      }
      return XML_ERROR_PARTIAL_CHAR;
    case XML_TOK_ENTITY_REF:
      {
        const XML_Char *name;
        ENTITY *entity;
        XML_Char ch = XmlPredefinedEntityName(enc,
                                              s + enc->minBytesPerChar,
                                              next - enc->minBytesPerChar);
        if (ch) {
          if (characterDataHandler)
            characterDataHandler(handlerArg, &ch, 1);
          else if (defaultHandler)
            reportDefault(parser, enc, s, next);
          break;
        }
        name = poolStoreString(&dtd.pool, enc,
                                s + enc->minBytesPerChar,
                                next - enc->minBytesPerChar);
        if (!name)
          return XML_ERROR_NO_MEMORY;
        entity = (ENTITY *)lookup(&dtd.generalEntities, name, 0);
        poolDiscard(&dtd.pool);
        if (!entity) {
          if (dtd.complete || dtd.standalone)
            return XML_ERROR_UNDEFINED_ENTITY;
          if (defaultHandler)
            reportDefault(parser, enc, s, next);
          break;
        }
        if (entity->open)
          return XML_ERROR_RECURSIVE_ENTITY_REF;
        if (entity->notation)
          return XML_ERROR_BINARY_ENTITY_REF;
        if (entity) {
          if (entity->textPtr) {
            enum XML_Error result;
            OPEN_INTERNAL_ENTITY openEntity;
            if (defaultHandler && !defaultExpandInternalEntities) {
              reportDefault(parser, enc, s, next);
              break;
            }
            entity->open = 1;
            openEntity.next = openInternalEntities;
            openInternalEntities = &openEntity;
            openEntity.entity = entity;
            openEntity.internalEventPtr = 0;
            openEntity.internalEventEndPtr = 0;
            result = doContent(parser,
                               tagLevel,
                               internalEncoding,
                               (char *)entity->textPtr,
                               (char *)(entity->textPtr + entity->textLen),
                               0);
            entity->open = 0;
            openInternalEntities = openEntity.next;
            if (result)
              return result;
          }
          else if (externalEntityRefHandler) {
            const XML_Char *context;
            entity->open = 1;
            context = getContext(parser);
            entity->open = 0;
            if (!context)
              return XML_ERROR_NO_MEMORY;
            if (!externalEntityRefHandler(externalEntityRefHandlerArg,
                                          context,
                                          entity->base,
                                          entity->systemId,
                                          entity->publicId))
              return XML_ERROR_EXTERNAL_ENTITY_HANDLING;
            poolDiscard(&tempPool);
          }
          else if (defaultHandler)
            reportDefault(parser, enc, s, next);
        }
        break;
      }
    case XML_TOK_START_TAG_WITH_ATTS:
      if (!startElementHandler) {
        enum XML_Error result = storeAtts(parser, enc, s, 0, 0);
        if (result)
          return result;
      }
      /* fall through */
    case XML_TOK_START_TAG_NO_ATTS:
      {
        TAG *tag;
        if (freeTagList) {
          tag = freeTagList;
          freeTagList = freeTagList->parent;
        }
        else {
          tag = MALLOC(sizeof(TAG));
          if (!tag)
            return XML_ERROR_NO_MEMORY;
          tag->buf = MALLOC(INIT_TAG_BUF_SIZE);
          if (!tag->buf)
            return XML_ERROR_NO_MEMORY;
          tag->bufEnd = tag->buf + INIT_TAG_BUF_SIZE;
        }
        tag->bindings = 0;
        tag->parent = tagStack;
        tagStack = tag;
        tag->name.localPart = 0;
        tag->rawName = s + enc->minBytesPerChar;
        tag->rawNameLength = XmlNameLength(enc, tag->rawName);
        if (nextPtr) {
          /* Need to guarantee that:
             tag->buf + ROUND_UP(tag->rawNameLength, sizeof(XML_Char)) <= tag->bufEnd - sizeof(XML_Char) */
          if (tag->rawNameLength + (int)(sizeof(XML_Char) - 1) + (int)sizeof(XML_Char) > tag->bufEnd - tag->buf) {
            int bufSize = tag->rawNameLength * 4;
            bufSize = ROUND_UP(bufSize, sizeof(XML_Char));
            tag->buf = REALLOC(tag->buf, bufSize);
            if (!tag->buf)
              return XML_ERROR_NO_MEMORY;
            tag->bufEnd = tag->buf + bufSize;
          }
          memcpy(tag->buf, tag->rawName, tag->rawNameLength);
          tag->rawName = tag->buf;
        }
        ++tagLevel;
        if (startElementHandler) {
          enum XML_Error result;
          XML_Char *toPtr;
          for (;;) {
            const char *rawNameEnd = tag->rawName + tag->rawNameLength;
            const char *fromPtr = tag->rawName;
            int bufSize;
            if (nextPtr)
              toPtr = (XML_Char *)(tag->buf + ROUND_UP(tag->rawNameLength, sizeof(XML_Char)));
            else
              toPtr = (XML_Char *)tag->buf;
            tag->name.str = toPtr;
            XmlConvert(enc,
                       &fromPtr, rawNameEnd,
                       (ICHAR **)&toPtr, (ICHAR *)tag->bufEnd - 1);
            if (fromPtr == rawNameEnd)
              break;
            bufSize = (tag->bufEnd - tag->buf) << 1;
            tag->buf = REALLOC(tag->buf, bufSize);
            if (!tag->buf)
              return XML_ERROR_NO_MEMORY;
            tag->bufEnd = tag->buf + bufSize;
            if (nextPtr)
              tag->rawName = tag->buf;
          }
          *toPtr = XML_T('\0');
          result = storeAtts(parser, enc, s, &(tag->name), &(tag->bindings));
          if (result)
            return result;
          startElementHandler(handlerArg, tag->name.str, (const XML_Char **)atts);
          poolClear(&tempPool);
        }
        else {
          tag->name.str = 0;
          if (defaultHandler)
            reportDefault(parser, enc, s, next);
        }
        break;
      }
    case XML_TOK_EMPTY_ELEMENT_WITH_ATTS:
      if (!startElementHandler) {
        enum XML_Error result = storeAtts(parser, enc, s, 0, 0);
        if (result)
          return result;
      }
      /* fall through */
    case XML_TOK_EMPTY_ELEMENT_NO_ATTS:
      if (startElementHandler || endElementHandler) {
        const char *rawName = s + enc->minBytesPerChar;
        enum XML_Error result;
        BINDING *bindings = 0;
        TAG_NAME name;
        name.str = poolStoreString(&tempPool, enc, rawName,
                                   rawName + XmlNameLength(enc, rawName));
        if (!name.str)
          return XML_ERROR_NO_MEMORY;
        poolFinish(&tempPool);
        result = storeAtts(parser, enc, s, &name, &bindings);
        if (result)
          return result;
        poolFinish(&tempPool);
        if (startElementHandler)
          startElementHandler(handlerArg, name.str, (const XML_Char **)atts);
        if (endElementHandler) {
          if (startElementHandler)
            *eventPP = *eventEndPP;
          endElementHandler(handlerArg, name.str);
        }
        poolClear(&tempPool);
        while (bindings) {
          BINDING *b = bindings;
          if (endNamespaceDeclHandler)
            endNamespaceDeclHandler(handlerArg, b->prefix->name);
          bindings = bindings->nextTagBinding;
          b->nextTagBinding = freeBindingList;
          freeBindingList = b;
          b->prefix->binding = b->prevPrefixBinding;
        }
      }
      else if (defaultHandler)
        reportDefault(parser, enc, s, next);
      if (tagLevel == 0)
        return epilogProcessor(parser, next, end, nextPtr);
      break;
    case XML_TOK_END_TAG:
      if (tagLevel == startTagLevel)
        return XML_ERROR_ASYNC_ENTITY;
      else {
        int len;
        const char *rawName;
        TAG *tag = tagStack;
        tagStack = tag->parent;
        tag->parent = freeTagList;
        freeTagList = tag;
        rawName = s + enc->minBytesPerChar*2;
        len = XmlNameLength(enc, rawName);
        if (len != tag->rawNameLength
            || memcmp(tag->rawName, rawName, len) != 0) {
          *eventPP = rawName;
          return XML_ERROR_TAG_MISMATCH;
        }
        --tagLevel;
        if (endElementHandler && tag->name.str) {
          if (tag->name.localPart) {
            XML_Char *to = (XML_Char *)tag->name.str + tag->name.uriLen;
            const XML_Char *from = tag->name.localPart;
            while ((*to++ = *from++) != 0)
              ;
          }
          endElementHandler(handlerArg, tag->name.str);
        }
        else if (defaultHandler)
          reportDefault(parser, enc, s, next);
        while (tag->bindings) {
          BINDING *b = tag->bindings;
          if (endNamespaceDeclHandler)
            endNamespaceDeclHandler(handlerArg, b->prefix->name);
          tag->bindings = tag->bindings->nextTagBinding;
          b->nextTagBinding = freeBindingList;
          freeBindingList = b;
          b->prefix->binding = b->prevPrefixBinding;
        }
        if (tagLevel == 0)
          return epilogProcessor(parser, next, end, nextPtr);
      }
      break;
    case XML_TOK_CHAR_REF:
      {
        int n = XmlCharRefNumber(enc, s);
        if (n < 0)
          return XML_ERROR_BAD_CHAR_REF;
        if (characterDataHandler) {
          XML_Char buf[XML_ENCODE_MAX];
          characterDataHandler(handlerArg, buf, XmlEncode(n, (ICHAR *)buf));
        }
        else if (defaultHandler)
          reportDefault(parser, enc, s, next);
      }
      break;
    case XML_TOK_XML_DECL:
      return XML_ERROR_MISPLACED_XML_PI;
    case XML_TOK_DATA_NEWLINE:
      if (characterDataHandler) {
        XML_Char c = 0xA;
        characterDataHandler(handlerArg, &c, 1);
      }
      else if (defaultHandler)
        reportDefault(parser, enc, s, next);
      break;
    case XML_TOK_CDATA_SECT_OPEN:
      {
        enum XML_Error result;
        if (startCdataSectionHandler)
          startCdataSectionHandler(handlerArg);
#if 0
        /* Suppose you doing a transformation on a document that involves
           changing only the character data.  You set up a defaultHandler
           and a characterDataHandler.  The defaultHandler simply copies
           characters through.  The characterDataHandler does the transformation
           and writes the characters out escaping them as necessary.  This case
           will fail to work if we leave out the following two lines (because &
           and < inside CDATA sections will be incorrectly escaped).

           However, now we have a start/endCdataSectionHandler, so it seems
           easier to let the user deal with this. */

        else if (characterDataHandler)
          characterDataHandler(handlerArg, dataBuf, 0);
#endif
        else if (defaultHandler)
          reportDefault(parser, enc, s, next);
        result = doCdataSection(parser, enc, &next, end, nextPtr);
        if (!next) {
          processor = cdataSectionProcessor;
          return result;
        }
      }
      break;
    case XML_TOK_TRAILING_RSQB:
      if (nextPtr) {
        *nextPtr = s;
        return XML_ERROR_NONE;
      }
      if (characterDataHandler) {
        if (MUST_CONVERT(enc, s)) {
          ICHAR *dataPtr = (ICHAR *)dataBuf;
          XmlConvert(enc, &s, end, &dataPtr, (ICHAR *)dataBufEnd);
          characterDataHandler(handlerArg, dataBuf, dataPtr - (ICHAR *)dataBuf);
        }
        else
          characterDataHandler(handlerArg,
                               (XML_Char *)s,
                               (XML_Char *)end - (XML_Char *)s);
      }
      else if (defaultHandler)
        reportDefault(parser, enc, s, end);
      if (startTagLevel == 0) {
        *eventPP = end;
        return XML_ERROR_NO_ELEMENTS;
      }
      if (tagLevel != startTagLevel) {
        *eventPP = end;
        return XML_ERROR_ASYNC_ENTITY;
      }
      return XML_ERROR_NONE;
    case XML_TOK_DATA_CHARS:
      if (characterDataHandler) {
        if (MUST_CONVERT(enc, s)) {
          for (;;) {
            ICHAR *dataPtr = (ICHAR *)dataBuf;
            XmlConvert(enc, &s, next, &dataPtr, (ICHAR *)dataBufEnd);
            *eventEndPP = s;
            characterDataHandler(handlerArg, dataBuf, dataPtr - (ICHAR *)dataBuf);
            if (s == next)
              break;
            *eventPP = s;
          }
        }
        else
          characterDataHandler(handlerArg,
                               (XML_Char *)s,
                               (XML_Char *)next - (XML_Char *)s);
      }
      else if (defaultHandler)
        reportDefault(parser, enc, s, next);
      break;
    case XML_TOK_PI:
      if (!reportProcessingInstruction(parser, enc, s, next))
        return XML_ERROR_NO_MEMORY;
      break;
    case XML_TOK_COMMENT:
      if (!reportComment(parser, enc, s, next))
        return XML_ERROR_NO_MEMORY;
      break;
    default:
      if (defaultHandler)
        reportDefault(parser, enc, s, next);
      break;
    }
    *eventPP = s = next;
  }
  /* not reached */
}